

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenavitHartenberg.cpp
# Opt level: O1

bool iDynTree::checkIfAxesAreIncident(Axis *line_A,Axis *line_B,double tol)

{
  double *pdVar1;
  bool bVar2;
  undefined1 uVar3;
  PointerType ptr_1;
  double *pdVar4;
  PointerType ptr;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Position closest_point_line_B;
  Position closest_point_line_A;
  Direction originDiffDirection;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double local_c8;
  double dStack_c0;
  double local_b8;
  undefined1 local_a8 [16];
  double local_98;
  Axis local_90;
  Axis local_60;
  
  iDynTree::Position::Position((Position *)&local_c8);
  iDynTree::Position::Position((Position *)&local_e8);
  iDynTree::Axis::Axis(&local_60,line_A);
  iDynTree::Axis::Axis(&local_90,line_B);
  bVar2 = closestPoints(&local_60,&local_90,(Position *)&local_c8,(Position *)&local_e8,1e-06);
  if (bVar2) {
    uVar3 = SQRT((local_b8 - local_d8) * (local_b8 - local_d8) +
                 (dStack_c0 - dStack_e0) * (dStack_c0 - dStack_e0) +
                 (local_c8 - local_e8) * (local_c8 - local_e8)) < tol;
  }
  else {
    pdVar1 = (double *)iDynTree::Axis::getOrigin();
    pdVar4 = (double *)iDynTree::Axis::getOrigin();
    uVar3 = true;
    if (tol <= SQRT((pdVar1[2] - pdVar4[2]) * (pdVar1[2] - pdVar4[2]) +
                    (pdVar1[1] - pdVar4[1]) * (pdVar1[1] - pdVar4[1]) +
                    (*pdVar1 - *pdVar4) * (*pdVar1 - *pdVar4))) {
      pdVar1 = (double *)iDynTree::Axis::getOrigin();
      pdVar4 = (double *)iDynTree::Axis::getOrigin();
      local_a8._0_8_ = *pdVar1 - *pdVar4;
      local_a8._8_8_ = pdVar1[1] - pdVar4[1];
      local_98 = pdVar1[2] - pdVar4[2];
      auVar5._0_8_ = local_98 * local_98 +
                     local_a8._8_8_ * local_a8._8_8_ + local_a8._0_8_ * local_a8._0_8_;
      if (0.0 < auVar5._0_8_) {
        auVar5._8_8_ = 0;
        auVar5 = sqrtpd(auVar5,auVar5);
        auVar6._0_8_ = auVar5._0_8_;
        local_98 = local_98 / auVar6._0_8_;
        auVar6._8_8_ = auVar6._0_8_;
        local_a8 = divpd(local_a8,auVar6);
      }
      iDynTree::Axis::getDirection();
      uVar3 = iDynTree::Direction::isParallel((Direction *)local_a8,tol);
    }
  }
  return (bool)uVar3;
}

Assistant:

bool checkIfAxesAreIncident(const iDynTree::Axis line_A,
                            const iDynTree::Axis line_B,
                                  double tol=1e-6)
{
    Position closest_point_line_A, closest_point_line_B;
    bool areAxesNotParallel = closestPoints(line_A, line_B, closest_point_line_A, closest_point_line_B);

    if (areAxesNotParallel)
    {
        bool arePointCoincident = ((toEigen(closest_point_line_A)-toEigen(closest_point_line_B)).norm() < tol);

        return arePointCoincident;
    }
    else
    {
        // If the axes are parallel, the axes are incident if they are coincident
        // In particular, they are coincident either if the origin are coincident
        // or if the difference between the origin is parallel as well
        bool areOriginCoincident = ((toEigen(line_A.getOrigin())-toEigen(line_B.getOrigin())).norm() < tol);

        if (areOriginCoincident)
        {
            return true;
        }

        Direction originDiffDirection;
        toEigen(originDiffDirection) = (toEigen(line_A.getOrigin())-toEigen(line_B.getOrigin())).normalized();

        bool areAxisCoincident = originDiffDirection.isParallel(line_A.getDirection(),tol);

        return areAxisCoincident;
    }
}